

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluDeriveDisjoint4
               (word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r,word *pTruth0,
               word *pTruth1)

{
  int iVar1;
  int iVar2;
  word wVar3;
  byte bVar4;
  int nFSset;
  int RetValue;
  int i;
  word Cof1;
  word Cof0;
  word pCofs [6] [256];
  If_Grp_t *r_local;
  If_Grp_t *g_local;
  int *P2V_local;
  int *V2P_local;
  int nVars_local;
  word *pF_local;
  
  iVar1 = nVars - g->nVars;
  pCofs[5][0xff] = (word)r;
  if ((g->nVars < '\a') && (iVar1 < 5)) {
    iVar2 = If_CluCountCofs4(pF,nVars,(int)g->nVars,(word (*) [256])&Cof0);
    if ((iVar2 != 3) && (iVar2 != 4)) {
      printf("If_CluDeriveDisjoint4(): Error!!!\n");
    }
    bVar4 = (byte)iVar1;
    *pF = (pCofs[2][0xff] << ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) | pCofs[1][0xff]) <<
          ((byte)(1 << (bVar4 + 1 & 0x1f)) & 0x3f) |
          pCofs[0][0xff] << ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) | Cof0;
    wVar3 = If_CluAdjust(*pF,iVar1 + 2);
    *pF = wVar3;
    *(byte *)pCofs[5][0xff] = bVar4 + 2;
    *(undefined1 *)(pCofs[5][0xff] + 1) = 0;
    for (nFSset = 0; nFSset < iVar1; nFSset = nFSset + 1) {
      *(char *)(pCofs[5][0xff] + 2 + (long)nFSset) = (char)P2V[nFSset];
    }
    *(char *)(pCofs[5][0xff] + 2 + (long)iVar1) = (char)nVars;
    *(char *)(pCofs[5][0xff] + 2 + (long)(iVar1 + 1)) = (char)nVars + '\x01';
    wVar3 = If_CluAdjust(pCofs[3][0xff],(int)g->nVars);
    *pTruth0 = wVar3;
    wVar3 = If_CluAdjust(pCofs[4][0xff],(int)g->nVars);
    *pTruth1 = wVar3;
    return;
  }
  __assert_fail("g->nVars <= 6 && nFSset <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x4be,
                "void If_CluDeriveDisjoint4(word *, int, int *, int *, If_Grp_t *, If_Grp_t *, word *, word *)"
               );
}

Assistant:

void If_CluDeriveDisjoint4( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r, word * pTruth0, word * pTruth1 )
{
    word pCofs[6][CLU_WRD_MAX/4];
    word Cof0, Cof1;
    int i, RetValue, nFSset = nVars - g->nVars;

    assert( g->nVars <= 6 && nFSset <= 4 );

    RetValue = If_CluCountCofs4( pF, nVars, g->nVars, pCofs );
    if ( RetValue != 3 && RetValue != 4 )
        printf( "If_CluDeriveDisjoint4(): Error!!!\n" );

    Cof0  = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    Cof1  = (pCofs[3][0] << (1 << nFSset)) | pCofs[2][0];
    pF[0] = (Cof1 << (1 << (nFSset+1))) | Cof0;
    pF[0] = If_CluAdjust( pF[0], nFSset + 2 );

    // create the resulting group
    r->nVars = nFSset + 2;
    r->nMyu = 0;
    for ( i = 0; i < nFSset; i++ )
        r->pVars[i] = P2V[i];
    r->pVars[nFSset] = nVars;
    r->pVars[nFSset+1] = nVars+1;

    *pTruth0 = If_CluAdjust( pCofs[4][0], g->nVars );
    *pTruth1 = If_CluAdjust( pCofs[5][0], g->nVars );
}